

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O0

int ARKStepSetExplicit(void *arkode_mem)

{
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  long *in_stack_ffffffffffffffe0;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = arkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffe8,(char *)in_stack_ffffffffffffffe0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (ARKodeARKStepMem *)0x11edc4);
  if (local_4 == 0) {
    if (*in_stack_ffffffffffffffe0 == 0) {
      arkProcessError(in_stack_ffffffffffffffe8,-0x16,0x34,"ARKStepSetExplicit",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,
                      "Cannot specify that method is explicit without providing a function pointer to fe(t,y)."
                     );
      local_4 = -0x16;
    }
    else {
      *(undefined4 *)((long)in_stack_ffffffffffffffe0 + 0x1c) = 1;
      *(undefined4 *)(in_stack_ffffffffffffffe0 + 4) = 0;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKStepSetExplicit(void* arkode_mem)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* ensure that fe is defined */
  if (step_mem->fe == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_MISSING_FE);
    return (ARK_ILL_INPUT);
  }

  /* set the relevant parameters */
  step_mem->explicit = SUNTRUE;
  step_mem->implicit = SUNFALSE;

  return (ARK_SUCCESS);
}